

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O1

void __thiscall
absl::debugging_internal::ElfMemImage::SymbolIterator::Update(SymbolIterator *this,int increment)

{
  uint uVar1;
  uint uVar2;
  ElfMemImage *this_00;
  Elf64_Word *pEVar3;
  char *pcVar4;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar5;
  Elf64_Verdef *pEVar6;
  void *pvVar7;
  Elf64_Word EVar8;
  int index;
  char *pcVar9;
  
  this_00 = (ElfMemImage *)this->image_;
  if ((increment != 0) && (this_00->ehdr_ == (Elf64_Ehdr *)0x0)) {
    Update();
  }
  if (this_00->ehdr_ != (Elf64_Ehdr *)0x0) {
    index = increment + this->index_;
    this->index_ = index;
    pEVar3 = this_00->hash_;
    if (pEVar3 == (Elf64_Word *)0x0) {
      EVar8 = 0;
    }
    else {
      EVar8 = pEVar3[1];
    }
    if (index < (int)EVar8) {
      sym = GetDynsym(this_00,index);
      pEVar5 = GetVersym(this_00,this->index_);
      if ((sym == (Elf64_Sym *)0x0) || (pEVar5 == (Elf64_Versym *)0x0)) {
        Update();
      }
      uVar1 = sym->st_name;
      if (this_00->strsize_ <= (ulong)uVar1) {
        Update();
      }
      pcVar4 = this_00->dynstr_;
      if (sym->st_shndx == 0) {
        pEVar6 = (Elf64_Verdef *)0x0;
      }
      else {
        pEVar6 = GetVerdef(this_00,*pEVar5 & 0x7fff);
      }
      if (pEVar6 == (Elf64_Verdef *)0x0) {
        pcVar9 = "";
      }
      else {
        if ((ushort)(pEVar6->vd_cnt - 3) < 0xfffe) {
          Update();
        }
        uVar2._0_2_ = pEVar6[1].vd_version;
        uVar2._2_2_ = pEVar6[1].vd_flags;
        if (this_00->strsize_ <= (ulong)uVar2) {
          Update();
        }
        pcVar9 = this_00->dynstr_ + uVar2;
      }
      (this->info_).name = pcVar4 + uVar1;
      (this->info_).version = pcVar9;
      pvVar7 = GetSymAddr(this_00,sym);
      (this->info_).address = pvVar7;
      (this->info_).symbol = sym;
    }
    else {
      if (pEVar3 == (Elf64_Word *)0x0) {
        EVar8 = 0;
      }
      else {
        EVar8 = pEVar3[1];
      }
      this->index_ = EVar8;
    }
  }
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(int increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}